

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

bool __thiscall S2Polygon::FindLoopNestingError(S2Polygon *this,S2Error *error)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  pointer puVar6;
  char *pcVar7;
  pointer puVar8;
  ulong uVar9;
  
  puVar8 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (ulong)((long)puVar6 - (long)puVar8) >> 3;
  uVar5 = 0;
  uVar9 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar9 = uVar5;
  }
  iVar3 = -1;
  while( true ) {
    if (uVar9 == uVar5) {
      uVar9 = 0;
      do {
        if ((long)(int)((ulong)((long)puVar6 - (long)puVar8) >> 3) <= (long)uVar9) {
          return false;
        }
        iVar3 = GetLastDescendant(this,(int)uVar9);
        for (uVar4 = 0; (long)uVar4 < (long)(int)((ulong)((long)puVar6 - (long)puVar8) >> 3);
            uVar4 = uVar4 + 1) {
          if (uVar9 != uVar4) {
            bVar2 = S2Loop::ContainsNonCrossingBoundary
                              ((S2Loop *)
                               puVar8[uVar9]._M_t.
                               super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,
                               (S2Loop *)
                               puVar8[uVar4]._M_t.
                               super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,
                               false);
            if (((long)uVar4 <= (long)iVar3 && uVar9 < uVar4) != bVar2) {
              pcVar7 = "not ";
              if ((long)uVar4 <= (long)iVar3 && uVar9 < uVar4) {
                pcVar7 = "";
              }
              S2Error::Init(error,POLYGON_INVALID_LOOP_NESTING,
                            "Invalid nesting: loop %d should %scontain loop %d",uVar9 & 0xffffffff,
                            pcVar7,uVar4 & 0xffffffff);
              return true;
            }
            puVar8 = (this->loops_).
                     super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar6 = (this->loops_).
                     super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        uVar9 = uVar9 + 1;
      } while( true );
    }
    iVar1 = *(int *)((long)puVar8[uVar5]._M_t.
                           super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t + 8);
    if ((iVar1 < 0) || (iVar3 + 1 < iVar1)) break;
    uVar5 = uVar5 + 1;
    iVar3 = iVar1;
  }
  S2Error::Init(error,POLYGON_INVALID_LOOP_DEPTH,"Loop %d: invalid loop depth (%d)");
  return true;
}

Assistant:

bool S2Polygon::FindLoopNestingError(S2Error* error) const {
  // First check that the loop depths make sense.
  for (int last_depth = -1, i = 0; i < num_loops(); ++i) {
    int depth = loop(i)->depth();
    if (depth < 0 || depth > last_depth + 1) {
      error->Init(S2Error::POLYGON_INVALID_LOOP_DEPTH,
                  "Loop %d: invalid loop depth (%d)", i, depth);
      return true;
    }
    last_depth = depth;
  }
  // Then check that they correspond to the actual loop nesting.  This test
  // is quadratic in the number of loops but the cost per iteration is small.
  for (int i = 0; i < num_loops(); ++i) {
    int last = GetLastDescendant(i);
    for (int j = 0; j < num_loops(); ++j) {
      if (i == j) continue;
      bool nested = (j >= i + 1) && (j <= last);
      const bool reverse_b = false;
      if (loop(i)->ContainsNonCrossingBoundary(loop(j), reverse_b) != nested) {
        error->Init(S2Error::POLYGON_INVALID_LOOP_NESTING,
                    "Invalid nesting: loop %d should %scontain loop %d",
                    i, nested ? "" : "not ", j);
        return true;
      }
    }
  }
  return false;
}